

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<double>,double,duckdb::NumericAverageOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar9 = 0;
      do {
        if (lVar2 == 0) {
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
LAB_003fb735:
          lVar11 = uVar6 - uVar9;
          uVar7 = uVar9;
          if (uVar9 <= uVar6 && lVar11 != 0) {
            dVar13 = *(double *)(state + 8);
            do {
              dVar13 = dVar13 + *(double *)(lVar4 + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
            *(long *)state = lVar11 + *(long *)state;
            *(double *)(state + 8) = dVar13;
            uVar7 = uVar6;
          }
        }
        else {
          uVar3 = *(ulong *)(lVar2 + uVar5 * 8);
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_003fb735;
          uVar7 = uVar6;
          if ((uVar3 != 0) && (uVar7 = uVar9, uVar9 < uVar6)) {
            uVar12 = 0;
            do {
              if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                *(double *)(state + 8) =
                     *(double *)(lVar4 + uVar9 * 8 + uVar12 * 8) + *(double *)(state + 8);
              }
              uVar12 = uVar12 + 1;
              uVar7 = uVar6;
            } while (uVar6 - uVar9 != uVar12);
          }
        }
        uVar5 = uVar5 + 1;
        uVar9 = uVar7;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      pdVar1 = *(double **)(input + 0x20);
      *(idx_t *)state = *(long *)state + count;
      *(double *)(state + 8) = (double)(long)count * *pdVar1 + *(double *)(state + 8);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        dVar13 = *(double *)(state + 8);
        iVar8 = 0;
        do {
          iVar10 = iVar8;
          if (*local_68 != 0) {
            iVar10 = (idx_t)*(uint *)(*local_68 + iVar8 * 4);
          }
          dVar13 = dVar13 + *(double *)(local_60 + iVar10 * 8);
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar13;
      }
    }
    else if (count != 0) {
      lVar4 = *local_68;
      iVar8 = 0;
      do {
        iVar10 = iVar8;
        if (lVar4 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar4 + iVar8 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
          *(long *)state = *(long *)state + 1;
          *(double *)(state + 8) = *(double *)(local_60 + iVar10 * 8) + *(double *)(state + 8);
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}